

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O0

int AF_A_FireMissile(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *source;
  DObject *this;
  AWeapon *this_00;
  PClassActor *type;
  bool bVar1;
  bool local_66;
  bool local_63;
  AWeapon *weapon;
  player_t *player;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                  ,0x1cb,"int AF_A_FireMissile(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                  ,0x1cb,"int AF_A_FireMissile(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  source = (AActor *)(param->field_0).field_1.a;
  local_63 = true;
  if (source != (AActor *)0x0) {
    local_63 = DObject::IsKindOf((DObject *)source,AActor::RegistrationInfo.MyClass);
  }
  if (local_63 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                  ,0x1cb,"int AF_A_FireMissile(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar1 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
      bVar1 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar1) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x1cb,"int AF_A_FireMissile(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    this = (DObject *)param[1].field_0.field_1.a;
    local_66 = true;
    if (this != (DObject *)0x0) {
      local_66 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    }
    if (local_66 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x1cb,"int AF_A_FireMissile(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((numparam < 3) || (param[2].field_0.field_3.Type == 0xff)) {
    player = (player_t *)0x0;
  }
  else {
    bVar1 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar1 = true, param[2].field_0.field_1.atag != 8)) {
      bVar1 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar1) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x1cb,"int AF_A_FireMissile(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    player = (player_t *)param[2].field_0.field_1.a;
  }
  if ((source->player != (player_t *)0x0) &&
     ((((this_00 = source->player->ReadyWeapon, this_00 == (AWeapon *)0x0 ||
        (source->player == (player_t *)0x0)) || (player == (player_t *)0x0)) ||
      ((*(int *)&player->playerstate != 1 ||
       (bVar1 = AWeapon::DepleteAmmo(this_00,(bool)(this_00->bAltFire & 1),true,1), bVar1)))))) {
    type = PClass::FindActor("Rocket");
    P_SpawnPlayerMissile(source,type);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FireMissile)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}
	AWeapon *weapon = self->player->ReadyWeapon;
	if (weapon != NULL && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire, true, 1))
			return 0;
	}
	P_SpawnPlayerMissile (self, PClass::FindActor("Rocket"));
	return 0;
}